

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

CURLcode telnet_do(connectdata *conn,_Bool *done)

{
  byte *pbVar1;
  undefined4 *puVar2;
  byte bVar3;
  curl_socket_t sockfd;
  Curl_easy *data;
  int *piVar4;
  Curl_easy *pCVar5;
  undefined4 *puVar6;
  byte *pbVar7;
  ssize_t sVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  CURLcode CVar12;
  CURLcode CVar13;
  uint uVar14;
  void *pvVar15;
  curl_slist *pcVar16;
  curl_slist *pcVar17;
  size_t sVar18;
  long lVar19;
  char *pcVar20;
  uint nfds;
  ulong uVar21;
  long lVar22;
  int timeout_ms;
  bool bVar23;
  timeval newer;
  ssize_t nread;
  pollfd pfd [2];
  long local_218;
  long local_1c8;
  ssize_t local_1b8 [16];
  pollfd local_138;
  int local_130;
  undefined2 local_12c;
  ushort local_12a;
  
  data = conn->data;
  sockfd = conn->sock[0];
  *done = true;
  pvVar15 = (*Curl_ccalloc)(1,0x1ed0);
  if (pvVar15 == (void *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  (conn->data->req).protop = pvVar15;
  *(undefined4 *)((long)pvVar15 + 0x1ec8) = 0;
  *(long *)((long)pvVar15 + 0x1eb8) = (long)pvVar15 + 0x1cb8;
  *(undefined4 *)((long)pvVar15 + 0x814) = 1;
  *(undefined4 *)((long)pvVar15 + 0x1414) = 1;
  *(undefined4 *)((long)pvVar15 + 0x808) = 1;
  *(undefined8 *)((long)pvVar15 + 0x1408) = 0x100000001;
  *(undefined4 *)((long)pvVar15 + 0x1884) = 1;
  piVar4 = (int *)(data->req).protop;
  local_1b8[0xe] = 0;
  local_1b8[0xf] = 0;
  local_1b8[0xc] = 0;
  local_1b8[0xd] = 0;
  local_1b8[10] = 0;
  local_1b8[0xb] = 0;
  local_1b8[8] = 0;
  local_1b8[9] = 0;
  local_1b8[6] = 0;
  local_1b8[7] = 0;
  local_1b8[4] = 0;
  local_1b8[5] = 0;
  local_1b8[2] = 0;
  local_1b8[3] = 0;
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  CVar12 = CURLE_OK;
  memset(&local_138,0,0x100);
  pCVar5 = conn->data;
  pvVar15 = (pCVar5->req).protop;
  if ((conn->bits).user_passwd == true) {
    curl_msnprintf((char *)&local_138,0x100,"USER,%s",conn->user);
    pcVar16 = curl_slist_append(*(curl_slist **)((long)pvVar15 + 0x1cb0),(char *)&local_138);
    if (pcVar16 != (curl_slist *)0x0) {
      *(curl_slist **)((long)pvVar15 + 0x1cb0) = pcVar16;
      *(undefined4 *)((long)pvVar15 + 0x8a4) = 1;
      goto LAB_0012b9b0;
    }
    CVar12 = CURLE_OUT_OF_MEMORY;
  }
  else {
LAB_0012b9b0:
    pcVar16 = (pCVar5->set).telnet_options;
    bVar23 = pcVar16 == (curl_slist *)0x0;
    if (!bVar23) {
      bVar23 = false;
      CVar12 = CURLE_TELNET_OPTION_SYNTAX;
      do {
        iVar10 = __isoc99_sscanf(pcVar16->data,"%127[^= ]%*[ =]%255s",local_1b8,&local_138);
        if (iVar10 != 2) {
LAB_0012bb7c:
          pcVar20 = "Syntax error in telnet option: %s";
LAB_0012bb83:
          Curl_failf(pCVar5,pcVar20,pcVar16->data);
          goto LAB_0012bb98;
        }
        iVar10 = Curl_raw_equal((char *)local_1b8,"TTYPE");
        if (iVar10 == 0) {
          iVar10 = Curl_raw_equal((char *)local_1b8,"XDISPLOC");
          if (iVar10 == 0) {
            iVar10 = Curl_raw_equal((char *)local_1b8,"NEW_ENV");
            if (iVar10 == 0) {
              iVar10 = Curl_raw_equal((char *)local_1b8,"WS");
              if (iVar10 == 0) {
                iVar10 = Curl_raw_equal((char *)local_1b8,"BINARY");
                if (iVar10 == 0) {
                  CVar12 = CURLE_UNKNOWN_OPTION;
                  pcVar20 = "Unknown telnet option %s";
                  goto LAB_0012bb83;
                }
                iVar10 = atoi((char *)&local_138);
                if (iVar10 != 1) {
                  *(undefined4 *)((long)pvVar15 + 0x808) = 0;
                  *(undefined4 *)((long)pvVar15 + 0x1408) = 0;
                }
              }
              else {
                iVar10 = __isoc99_sscanf(&local_138,"%hu%*[xX]%hu",(long)pvVar15 + 0x1ca8,
                                         (long)pvVar15 + 0x1caa);
                if (iVar10 != 2) goto LAB_0012bb7c;
                *(undefined4 *)((long)pvVar15 + 0x884) = 1;
              }
            }
            else {
              pcVar17 = curl_slist_append(*(curl_slist **)((long)pvVar15 + 0x1cb0),
                                          (char *)&local_138);
              if (pcVar17 == (curl_slist *)0x0) {
                CVar12 = CURLE_OUT_OF_MEMORY;
                goto LAB_0012bb98;
              }
              *(curl_slist **)((long)pvVar15 + 0x1cb0) = pcVar17;
              *(undefined4 *)((long)pvVar15 + 0x8a4) = 1;
            }
          }
          else {
            strncpy((char *)((long)pvVar15 + 0x1c28),(char *)&local_138,0x7f);
            *(undefined1 *)((long)pvVar15 + 0x1ca7) = 0;
            *(undefined4 *)((long)pvVar15 + 0x894) = 1;
          }
        }
        else {
          strncpy((char *)((long)pvVar15 + 0x1c08),(char *)&local_138,0x1f);
          *(undefined1 *)((long)pvVar15 + 0x1c27) = 0;
          *(undefined4 *)((long)pvVar15 + 0x868) = 1;
        }
        pcVar16 = pcVar16->next;
        bVar23 = pcVar16 == (curl_slist *)0x0;
      } while (!bVar23);
      CVar12 = CURLE_OK;
    }
LAB_0012bb98:
    if (bVar23) goto LAB_0012bbcf;
  }
  curl_slist_free_all(*(curl_slist **)((long)pvVar15 + 0x1cb0));
  *(undefined8 *)((long)pvVar15 + 0x1cb0) = 0;
LAB_0012bbcf:
  if (CVar12 == CURLE_OK) {
    local_138.events = 1;
    iVar10 = (data->set).is_fread_set;
    local_138.fd = sockfd;
    if (iVar10 == 0) {
      local_130 = fileno((FILE *)(data->state).in);
      local_12c = 1;
      timeout_ms = 1000;
      nfds = 2;
    }
    else {
      timeout_ms = 100;
      nfds = 1;
    }
    pcVar20 = (data->state).buffer;
    bVar23 = true;
    local_1c8 = 0;
    local_218 = 0;
    CVar12 = CURLE_OK;
    do {
      bVar9 = bVar23;
      do {
        bVar23 = bVar9;
        if (!bVar23) goto LAB_0012c66d;
        iVar11 = Curl_poll(&local_138,nfds,timeout_ms);
        bVar9 = false;
      } while (iVar11 == -1);
      if (iVar11 == 0) {
        local_138.revents = 0;
        local_12a = 0;
      }
      if ((local_138.revents & 1U) == 0) {
LAB_0012bcaa:
        local_1b8[0] = 0;
        if (iVar10 == 0) {
          if ((local_12a & 1) != 0) {
            local_1b8[0] = read(local_130,pcVar20,0x3fff);
          }
LAB_0012bd74:
          if (local_1b8[0] < 1) {
            if (local_1b8[0] != 0) {
              bVar23 = false;
            }
          }
          else {
            CVar13 = send_telnet_data(conn,pcVar20,local_1b8[0]);
            CVar12 = CURLE_OK;
            if (CVar13 != CURLE_OK) goto LAB_0012c5ac;
            local_1c8 = local_1c8 + local_1b8[0];
            Curl_pgrsSetUploadCounter(data,local_1c8);
          }
        }
        else {
          sVar18 = (*(data->state).fread_func)(pcVar20,1,0x3fff,(data->state).in);
          local_1b8[0] = (ssize_t)(int)sVar18;
          if (sVar18 << 0x20 == 0x1000000000000000) {
            bVar23 = false;
          }
          else if (sVar18 << 0x20 != 0x1000000100000000) goto LAB_0012bd74;
        }
      }
      else {
        CVar12 = Curl_read(conn,sockfd,pcVar20,0x3fff,local_1b8);
        if (CVar12 == CURLE_OK) {
          if (local_1b8[0] < 1) {
            bVar23 = false;
            CVar12 = CURLE_OK;
          }
          else {
            lVar19 = local_1b8[0] + local_218;
            Curl_pgrsSetDownloadCounter(data,lVar19);
            sVar8 = local_1b8[0];
            local_218._0_4_ = (int)local_1b8[0];
            if (local_1b8[0] == 0) {
              uVar14 = 0xffffffff;
              local_218._0_4_ = 0;
            }
            else {
              pCVar5 = conn->data;
              puVar6 = (undefined4 *)(pCVar5->req).protop;
              pbVar1 = (byte *)(puVar6 + 0x7ae);
              puVar2 = puVar6 + 0x72e;
              uVar14 = 0xffffffff;
              lVar22 = 0;
              do {
                if (8 < (uint)puVar6[0x7b2]) goto LAB_0012c502;
                bVar3 = pcVar20[lVar22];
                uVar21 = (ulong)bVar3;
                switch(puVar6[0x7b2]) {
                case 0:
                  if (bVar3 == 0xd) {
                    puVar6[0x7b2] = 6;
                  }
                  else if (bVar3 == 0xff) {
                    puVar6[0x7b2] = 1;
                    goto LAB_0012c071;
                  }
LAB_0012c3c4:
                  if ((int)uVar14 < 0) {
                    uVar14 = (uint)lVar22;
                  }
                  break;
                case 1:
switchD_0012be4d_caseD_1:
                  switch(bVar3) {
                  case 0xfa:
                    *(undefined4 **)(puVar6 + 0x7ae) = puVar2;
LAB_0012c1e7:
                    puVar6[0x7b2] = 7;
                    break;
                  case 0xfb:
                    puVar6[0x7b2] = 2;
                    break;
                  case 0xfc:
                    puVar6[0x7b2] = 3;
                    break;
                  case 0xfd:
                    puVar6[0x7b2] = 4;
                    break;
                  case 0xfe:
                    puVar6[0x7b2] = 5;
                    break;
                  case 0xff:
                    puVar6[0x7b2] = 0;
                    goto LAB_0012c3c4;
                  default:
                    puVar6[0x7b2] = 0;
                    printoption(pCVar5,"RCVD",0xff,(uint)bVar3);
                  }
                  break;
                case 2:
                  printoption(pCVar5,"RCVD",0xfb,(uint)bVar3);
                  *puVar6 = 1;
                  pvVar15 = (conn->data->req).protop;
                  iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 0xc08);
                  if (iVar11 == 3) {
                    iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 0x1008);
                    if (iVar11 != 1) goto LAB_0012c2e1;
                    *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0xc08) = 1;
                    *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0x1008) = 0;
                  }
                  else if (iVar11 == 2) {
                    iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 0x1008);
                    if (iVar11 == 1) {
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0xc08) = 3;
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0x1008) = 0;
                      goto LAB_0012c4a2;
                    }
                    if (iVar11 == 0) {
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0xc08) = 1;
                    }
                  }
                  else if (iVar11 == 0) {
                    if (*(int *)((long)pvVar15 + uVar21 * 4 + 0x1408) == 1) {
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0xc08) = 1;
                      goto LAB_0012c4c4;
                    }
LAB_0012c4a2:
                    iVar11 = 0xfe;
                    goto LAB_0012c4eb;
                  }
                  goto LAB_0012c4f8;
                case 3:
                  printoption(pCVar5,"RCVD",0xfc,(uint)bVar3);
                  *puVar6 = 1;
                  pvVar15 = (conn->data->req).protop;
                  iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 0xc08);
                  if (iVar11 == 3) {
                    iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 0x1008);
                    if (iVar11 == 1) {
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0xc08) = 2;
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0x1008) = 0;
LAB_0012c4c4:
                      iVar11 = 0xfd;
                      goto LAB_0012c4eb;
                    }
LAB_0012c2e1:
                    if (iVar11 == 0) {
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0xc08) = 0;
                    }
                  }
                  else if (iVar11 == 2) {
                    iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 0x1008);
                    if (iVar11 != 1) goto LAB_0012c2e1;
                    *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0xc08) = 0;
                    *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0x1008) = 0;
                  }
                  else if (iVar11 == 1) {
                    *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0xc08) = 0;
                    goto LAB_0012c4a2;
                  }
                  goto LAB_0012c4f8;
                case 4:
                  printoption(pCVar5,"RCVD",0xfd,(uint)bVar3);
                  *puVar6 = 1;
                  pvVar15 = (conn->data->req).protop;
                  iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 8);
                  if (iVar11 == 3) {
                    iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 0x408);
                    if (iVar11 == 1) {
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 8) = 1;
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0x408) = 0;
                    }
                    else if (iVar11 == 0) {
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 8) = 0;
                    }
                  }
                  else if (iVar11 == 2) {
                    iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 0x408);
                    if (iVar11 == 1) {
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 8) = 3;
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0x1008) = 0;
LAB_0012c44b:
                      send_negotiation(conn,0xfc,(uint)bVar3);
                    }
                    else if (iVar11 == 0) {
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 8) = 1;
                      goto LAB_0012c218;
                    }
                  }
                  else if (iVar11 == 0) {
                    if (*(int *)((long)pvVar15 + uVar21 * 4 + 0x808) == 1) {
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 8) = 1;
                      send_negotiation(conn,0xfb,(uint)bVar3);
LAB_0012c218:
                      if (*(int *)((long)pvVar15 + uVar21 * 4 + 0x1808) != 1) goto LAB_0012c479;
                    }
                    else {
                      if (*(int *)((long)pvVar15 + uVar21 * 4 + 0x1808) != 1) goto LAB_0012c44b;
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 8) = 1;
                      send_negotiation(conn,0xfb,(uint)bVar3);
                    }
                    sendsuboption(conn,(uint)bVar3);
                  }
LAB_0012c479:
                  puVar6[0x7b2] = 0;
                  break;
                case 5:
                  printoption(pCVar5,"RCVD",0xfe,(uint)bVar3);
                  *puVar6 = 1;
                  pvVar15 = (conn->data->req).protop;
                  iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 8);
                  if (iVar11 == 3) {
                    iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 0x408);
                    if (iVar11 == 1) {
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 8) = 2;
                      *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0x408) = 0;
                      iVar11 = 0xfb;
LAB_0012c4eb:
                      send_negotiation(conn,iVar11,(uint)bVar3);
                    }
                    else {
LAB_0012c32c:
                      if (iVar11 == 0) {
                        *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 8) = 0;
                      }
                    }
                  }
                  else if (iVar11 == 2) {
                    iVar11 = *(int *)((long)pvVar15 + uVar21 * 4 + 0x408);
                    if (iVar11 != 1) goto LAB_0012c32c;
                    *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 8) = 0;
                    *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 0x408) = 0;
                  }
                  else if (iVar11 == 1) {
                    *(undefined4 *)((long)pvVar15 + uVar21 * 4 + 8) = 0;
                    iVar11 = 0xfc;
                    goto LAB_0012c4eb;
                  }
                  goto LAB_0012c4f8;
                case 6:
                  puVar6[0x7b2] = 0;
                  if (bVar3 != 0) goto LAB_0012c3c4;
LAB_0012c071:
                  if ((int)uVar14 < 0) {
                    uVar14 = 0xffffffff;
                  }
                  else {
                    CVar13 = Curl_client_write(conn,1,pcVar20 + uVar14,
                                               (long)(int)((uint)lVar22 - uVar14));
                    uVar14 = 0xffffffff;
                    if (CVar13 != CURLE_OK) goto LAB_0012c597;
                  }
                  break;
                case 7:
                  if (bVar3 == 0xff) {
                    puVar6[0x7b2] = 8;
                  }
                  else {
                    pbVar7 = *(byte **)pbVar1;
                    if (pbVar7 < pbVar1) {
                      *(byte **)pbVar1 = pbVar7 + 1;
                      *pbVar7 = bVar3;
                    }
                  }
                  break;
                case 8:
                  pbVar7 = *(byte **)pbVar1;
                  if (bVar3 != 0xf0) {
                    if (bVar3 != 0xff) {
                      if (pbVar7 < pbVar1) {
                        *(byte **)pbVar1 = pbVar7 + 1;
                        *pbVar7 = 0xff;
                      }
                      pbVar7 = *(byte **)pbVar1;
                      if (pbVar7 < pbVar1) {
                        *(byte **)pbVar1 = pbVar7 + 1;
                        *pbVar7 = bVar3;
                      }
                      *(long *)(puVar6 + 0x7b0) = *(long *)(puVar6 + 0x7ae) + -2;
                      *(undefined4 **)(puVar6 + 0x7ae) = puVar2;
                      printoption(pCVar5,"In SUBOPTION processing, RCVD",0xff,(uint)bVar3);
                      suboption(conn);
                      puVar6[0x7b2] = 1;
                      goto switchD_0012be4d_caseD_1;
                    }
                    if (pbVar7 < pbVar1) {
                      *(byte **)pbVar1 = pbVar7 + 1;
                      *pbVar7 = 0xff;
                    }
                    goto LAB_0012c1e7;
                  }
                  if (pbVar7 < pbVar1) {
                    *(byte **)pbVar1 = pbVar7 + 1;
                    *pbVar7 = 0xff;
                  }
                  pbVar7 = *(byte **)pbVar1;
                  if (pbVar7 < pbVar1) {
                    *(byte **)pbVar1 = pbVar7 + 1;
                    *pbVar7 = 0xf0;
                  }
                  *(long *)(puVar6 + 0x7b0) = *(long *)(puVar6 + 0x7ae) + -2;
                  *(undefined4 **)(puVar6 + 0x7ae) = puVar2;
                  suboption(conn);
LAB_0012c4f8:
                  puVar6[0x7b2] = 0;
                }
LAB_0012c502:
                lVar22 = lVar22 + 1;
              } while (sVar8 != lVar22);
            }
            if (((int)uVar14 < 0) ||
               (CVar13 = Curl_client_write(conn,1,pcVar20 + uVar14,
                                           (long)(int)((int)local_218 - uVar14)), CVar13 == CURLE_OK
               )) {
              CVar13 = CURLE_OK;
            }
LAB_0012c597:
            CVar12 = CURLE_OK;
            local_218 = lVar19;
            if (CVar13 == CURLE_OK) {
              if ((*piVar4 != 0) && (piVar4[1] == 0)) {
                negotiate(conn);
                piVar4[1] = 1;
              }
              goto LAB_0012bcaa;
            }
LAB_0012c5ac:
            bVar23 = false;
            CVar12 = CVar13;
          }
        }
        else if (CVar12 != CURLE_AGAIN) {
          bVar23 = false;
        }
      }
      if ((data->set).timeout != 0) {
        newer = curlx_tvnow();
        lVar19 = curlx_tvdiff(newer,conn->created);
        if ((data->set).timeout <= lVar19) {
          bVar23 = false;
          Curl_failf(data,"Time-out");
          CVar12 = CURLE_OPERATION_TIMEDOUT;
        }
      }
      iVar11 = Curl_pgrsUpdate(conn);
    } while (iVar11 == 0);
    CVar12 = CURLE_ABORTED_BY_CALLBACK;
LAB_0012c66d:
    Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
  }
  return CVar12;
}

Assistant:

static CURLcode telnet_do(struct connectdata *conn, bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
#ifdef USE_WINSOCK
  HMODULE wsock2;
  WSOCK2_FUNC close_event_func;
  WSOCK2_FUNC create_event_func;
  WSOCK2_FUNC event_select_func;
  WSOCK2_FUNC enum_netevents_func;
  WSAEVENT event_handle;
  WSANETWORKEVENTS events;
  HANDLE stdin_handle;
  HANDLE objs[2];
  DWORD  obj_count;
  DWORD  wait_timeout;
  DWORD waitret;
  DWORD readfile_read;
  int err;
#else
  int interval_ms;
  struct pollfd pfd[2];
  int poll_cnt;
  curl_off_t total_dl = 0;
  curl_off_t total_ul = 0;
#endif
  ssize_t nread;
  struct timeval now;
  bool keepon = TRUE;
  char *buf = data->state.buffer;
  struct TELNET *tn;

  *done = TRUE; /* unconditionally */

  result = init_telnet(conn);
  if(result)
    return result;

  tn = (struct TELNET *)data->req.protop;

  result = check_telnet_options(conn);
  if(result)
    return result;

#ifdef USE_WINSOCK
  /*
  ** This functionality only works with WinSock >= 2.0.  So,
  ** make sure have it.
  */
  result = check_wsock2(data);
  if(result)
    return result;

  /* OK, so we have WinSock 2.0.  We need to dynamically */
  /* load ws2_32.dll and get the function pointers we need. */
  wsock2 = Curl_load_library(TEXT("WS2_32.DLL"));
  if(wsock2 == NULL) {
    failf(data, "failed to load WS2_32.DLL (%d)", ERRNO);
    return CURLE_FAILED_INIT;
  }

  /* Grab a pointer to WSACreateEvent */
  create_event_func = GetProcAddress(wsock2, "WSACreateEvent");
  if(create_event_func == NULL) {
    failf(data, "failed to find WSACreateEvent function (%d)", ERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSACloseEvent */
  close_event_func = GetProcAddress(wsock2, "WSACloseEvent");
  if(close_event_func == NULL) {
    failf(data, "failed to find WSACloseEvent function (%d)", ERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSAEventSelect */
  event_select_func = GetProcAddress(wsock2, "WSAEventSelect");
  if(event_select_func == NULL) {
    failf(data, "failed to find WSAEventSelect function (%d)", ERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSAEnumNetworkEvents */
  enum_netevents_func = GetProcAddress(wsock2, "WSAEnumNetworkEvents");
  if(enum_netevents_func == NULL) {
    failf(data, "failed to find WSAEnumNetworkEvents function (%d)", ERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* We want to wait for both stdin and the socket. Since
  ** the select() function in winsock only works on sockets
  ** we have to use the WaitForMultipleObjects() call.
  */

  /* First, create a sockets event object */
  event_handle = (WSAEVENT)create_event_func();
  if(event_handle == WSA_INVALID_EVENT) {
    failf(data, "WSACreateEvent failed (%d)", SOCKERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* Tell winsock what events we want to listen to */
  if(event_select_func(sockfd, event_handle, FD_READ|FD_CLOSE) ==
     SOCKET_ERROR) {
    close_event_func(event_handle);
    FreeLibrary(wsock2);
    return CURLE_OK;
  }

  /* The get the Windows file handle for stdin */
  stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  /* Create the list of objects to wait for */
  objs[0] = event_handle;
  objs[1] = stdin_handle;

  /* If stdin_handle is a pipe, use PeekNamedPipe() method to check it,
     else use the old WaitForMultipleObjects() way */
  if(GetFileType(stdin_handle) == FILE_TYPE_PIPE ||
     data->set.is_fread_set) {
    /* Don't wait for stdin_handle, just wait for event_handle */
    obj_count = 1;
    /* Check stdin_handle per 100 milliseconds */
    wait_timeout = 100;
  }
  else {
    obj_count = 2;
    wait_timeout = 1000;
  }

  /* Keep on listening and act on events */
  while(keepon) {
    waitret = WaitForMultipleObjects(obj_count, objs, FALSE, wait_timeout);
    switch(waitret) {
    case WAIT_TIMEOUT:
    {
      for(;;) {
        if(data->set.is_fread_set) {
          /* read from user-supplied method */
          result = (int)data->state.fread_func(buf, 1, BUFSIZE - 1,
                                               data->state.in);
          if(result == CURL_READFUNC_ABORT) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(result == CURL_READFUNC_PAUSE)
            break;

          if(result == 0)                        /* no bytes */
            break;

          readfile_read = result; /* fall thru with number of bytes read */
        }
        else {
          /* read from stdin */
          if(!PeekNamedPipe(stdin_handle, NULL, 0, NULL,
                            &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(!readfile_read)
            break;

          if(!ReadFile(stdin_handle, buf, sizeof(data->state.buffer),
                       &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }
        }

        result = send_telnet_data(conn, buf, readfile_read);
        if(result) {
          keepon = FALSE;
          break;
        }
      }
    }
    break;

    case WAIT_OBJECT_0 + 1:
    {
      if(!ReadFile(stdin_handle, buf, sizeof(data->state.buffer),
                   &readfile_read, NULL)) {
        keepon = FALSE;
        result = CURLE_READ_ERROR;
        break;
      }

      result = send_telnet_data(conn, buf, readfile_read);
      if(result) {
        keepon = FALSE;
        break;
      }
    }
    break;

    case WAIT_OBJECT_0:

      events.lNetworkEvents = 0;
      if(SOCKET_ERROR == enum_netevents_func(sockfd, event_handle, &events)) {
        if((err = SOCKERRNO) != EINPROGRESS) {
          infof(data, "WSAEnumNetworkEvents failed (%d)", err);
          keepon = FALSE;
          result = CURLE_READ_ERROR;
        }
        break;
      }
      if(events.lNetworkEvents & FD_READ) {
        /* read data from network */
        result = Curl_read(conn, sockfd, buf, BUFSIZE - 1, &nread);
        /* read would've blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        result = telrcv(conn, (unsigned char *) buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise don't. We don't want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(conn);
          tn->already_negotiated = 1;
        }
      }
      if(events.lNetworkEvents & FD_CLOSE) {
        keepon = FALSE;
      }
      break;

    }

    if(data->set.timeout) {
      now = Curl_tvnow();
      if(Curl_tvdiff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }
  }

  /* We called WSACreateEvent, so call WSACloseEvent */
  if(!close_event_func(event_handle)) {
    infof(data, "WSACloseEvent failed (%d)", SOCKERRNO);
  }

  /* "Forget" pointers into the library we're about to free */
  create_event_func = NULL;
  close_event_func = NULL;
  event_select_func = NULL;
  enum_netevents_func = NULL;

  /* We called LoadLibrary, so call FreeLibrary */
  if(!FreeLibrary(wsock2))
    infof(data, "FreeLibrary(wsock2) failed (%d)", ERRNO);
#else
  pfd[0].fd = sockfd;
  pfd[0].events = POLLIN;

  if(data->set.is_fread_set) {
    poll_cnt = 1;
    interval_ms = 100; /* poll user-supplied read function */
  }
  else {
    /* really using fread, so infile is a FILE* */
    pfd[1].fd = fileno((FILE *)data->state.in);
    pfd[1].events = POLLIN;
    poll_cnt = 2;
    interval_ms = 1 * 1000;
  }

  while(keepon) {
    switch (Curl_poll(pfd, poll_cnt, interval_ms)) {
    case -1:                    /* error, stop reading */
      keepon = FALSE;
      continue;
    case 0:                     /* timeout */
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      /* fall through */
    default:                    /* read! */
      if(pfd[0].revents & POLLIN) {
        /* read data from network */
        result = Curl_read(conn, sockfd, buf, BUFSIZE - 1, &nread);
        /* read would've blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        total_dl += nread;
        Curl_pgrsSetDownloadCounter(data, total_dl);
        result = telrcv(conn, (unsigned char *)buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise don't. We don't want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(conn);
          tn->already_negotiated = 1;
        }
      }

      nread = 0;
      if(poll_cnt == 2) {
        if(pfd[1].revents & POLLIN) { /* read from in file */
          nread = read(pfd[1].fd, buf, BUFSIZE - 1);
        }
      }
      else {
        /* read from user-supplied method */
        nread = (int)data->state.fread_func(buf, 1, BUFSIZE - 1,
                                            data->state.in);
        if(nread == CURL_READFUNC_ABORT) {
          keepon = FALSE;
          break;
        }
        if(nread == CURL_READFUNC_PAUSE)
          break;
      }

      if(nread > 0) {
        result = send_telnet_data(conn, buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }
        total_ul += nread;
        Curl_pgrsSetUploadCounter(data, total_ul);
      }
      else if(nread < 0)
        keepon = FALSE;

      break;
    } /* poll switch statement */

    if(data->set.timeout) {
      now = Curl_tvnow();
      if(Curl_tvdiff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }

    if(Curl_pgrsUpdate(conn)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
#endif
  /* mark this as "no further transfer wanted" */
  Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

  return result;
}